

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

void XUtf8DrawString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                    char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  int *piVar2;
  int iVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  uint local_170;
  uint no_spc;
  uint ucs;
  int ulen;
  int *ranges;
  int iStack_158;
  char glyph [2];
  int nb_font;
  int last_fnum;
  int first;
  int i;
  int fnum;
  XChar2b buf [128];
  XFontStruct **fonts;
  int *encodings;
  int y_local;
  int x_local;
  GC gc_local;
  XUtf8FontStruct *font_set_local;
  Drawable d_local;
  Display *display_local;
  
  ranges._4_4_ = font_set->nb_font;
  if (0 < ranges._4_4_) {
    _ucs = font_set->ranges;
    ppXVar1 = font_set->fonts;
    piVar2 = font_set->encodings;
    last_fnum = 0;
    first = 0;
    while( true ) {
      iVar3 = first;
      bVar7 = false;
      if (first < ranges._4_4_) {
        bVar7 = ppXVar1[first] == (XFontStruct *)0x0;
      }
      if (!bVar7) break;
      first = first + 1;
    }
    encodings._4_4_ = x;
    if (first < ranges._4_4_) {
      for (; iStack_158 = first, 0 < num_bytes; num_bytes = num_bytes - no_spc) {
        if (0x78 < last_fnum) {
          XSetFont(display,gc,ppXVar1[first]->fid);
          XDrawString16(display,d,gc,encodings._4_4_,y,&i,last_fnum);
          iVar5 = XTextWidth16(ppXVar1[first],&i,last_fnum);
          encodings._4_4_ = iVar5 + encodings._4_4_;
          last_fnum = 0;
        }
        no_spc = XFastConvertUtf8ToUcs((uchar *)string,num_bytes,&local_170);
        if ((int)no_spc < 1) {
          no_spc = 1;
        }
        uVar4 = XUtf8IsNonSpacing(local_170);
        uVar6 = (uint)uVar4;
        first = iVar3;
        if (uVar6 != 0) {
          local_170 = uVar6;
        }
        while ((first < ranges._4_4_ &&
               (((ppXVar1[first] == (XFontStruct *)0x0 ||
                 (iVar5 = ucs2fontmap((char *)((long)&ranges + 2),local_170,piVar2[first]),
                 iVar5 < 0)) ||
                ((piVar2[first] == 0 &&
                 (((int)local_170 < _ucs[first << 1] || (_ucs[first * 2 + 1] < (int)local_170)))))))
               )) {
          first = first + 1;
        }
        if (first == ranges._4_4_) {
          ucs2fontmap((char *)((long)&ranges + 2),0x3f,piVar2[iVar3]);
          first = iVar3;
        }
        if ((iStack_158 == first) && (uVar6 == 0)) {
          *(undefined1 *)((long)&i + (long)last_fnum * 2) = ranges._2_1_;
          *(undefined1 *)((long)&i + (long)last_fnum * 2 + 1) = ranges._3_1_;
        }
        else {
          XSetFont(display,gc,ppXVar1[iStack_158]->fid);
          XDrawString16(display,d,gc,encodings._4_4_,y,&i,last_fnum);
          iVar5 = XTextWidth16(ppXVar1[iStack_158],&i,last_fnum);
          encodings._4_4_ = iVar5 + encodings._4_4_;
          last_fnum = 0;
          i._0_1_ = ranges._2_1_;
          i._1_1_ = ranges._3_1_;
          if (uVar6 != 0) {
            iVar5 = XTextWidth16(ppXVar1[first],&i,1);
            encodings._4_4_ = encodings._4_4_ - iVar5;
          }
        }
        last_fnum = last_fnum + 1;
        string = string + (int)no_spc;
      }
      XSetFont(display,gc,ppXVar1[first]->fid);
      XDrawString16(display,d,gc,encodings._4_4_,y,&i,last_fnum);
    }
  }
  return;
}

Assistant:

void
XUtf8DrawString(Display 	*display,
	        Drawable 	d,
                XUtf8FontStruct *font_set,
	        GC 		gc,
	        int 		x,
	        int 		y,
	        const char	*string,
                int 		num_bytes) {

  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  XDrawString16(display, d, gc, x, y, buf, i);
}